

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,FunctionCallNode *node)

{
  bool bVar1;
  _Storage<std::reference_wrapper<RuntimeSymbol>,_true> _Var2;
  optional<std::reference_wrapper<RuntimeSymbol>_> oVar3;
  string name;
  RuntimeFunctionAnalyser functionAnalyser;
  RuntimeVariableAnalyser variableAnalyser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  RuntimeFunctionAnalyser local_98;
  RuntimeVariableAnalyser local_58;
  
  std::__cxx11::string::string((string *)&bStack_b8,(string *)&node->name_);
  bVar1 = std::operator==(&bStack_b8,"print");
  if (bVar1) {
    handlePrint(this,node);
  }
  else {
    bVar1 = std::operator==(&bStack_b8,"if");
    if (bVar1) {
      handleIf(this,node);
    }
    else {
      oVar3 = Context::lookup(&this->context_,&bStack_b8,0);
      _Var2 = oVar3.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>.
              _M_payload.super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_>.
              _M_payload;
      RuntimeFunctionAnalyser::RuntimeFunctionAnalyser(&local_98);
      if (((undefined1  [16])
           oVar3.super__Optional_base<std::reference_wrapper<RuntimeSymbol>,_true,_true>._M_payload.
           super__Optional_payload_base<std::reference_wrapper<RuntimeSymbol>_> &
          (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__throw_bad_optional_access();
      }
      (**(code **)(*(long *)_Var2 + 0x10))(_Var2,&local_98);
      if (local_98.symbolValid_ == true) {
        handleFunctionCall(this,node,&local_98);
      }
      else {
        RuntimeVariableAnalyser::RuntimeVariableAnalyser(&local_58);
        (**(code **)(*(long *)_Var2 + 0x10))(_Var2,&local_58);
        handleVariableCall(this,node,&local_58);
        RuntimeVariableAnalyser::~RuntimeVariableAnalyser(&local_58);
      }
      RuntimeFunctionAnalyser::~RuntimeFunctionAnalyser(&local_98);
    }
  }
  std::__cxx11::string::~string((string *)&bStack_b8);
  return;
}

Assistant:

void Executor::visit(const FunctionCallNode& node)
{
  const auto name = node.getName();
  if(name == "print")
    handlePrint(node);
  else if(name == "if")
    handleIf(node);
  else
  {
    const auto symbol = context_.lookup(name);
    auto functionAnalyser = RuntimeFunctionAnalyser{};
    symbol.value().get().accept(functionAnalyser);

    if(functionAnalyser.isSymbolValid())
    {
      handleFunctionCall(node, functionAnalyser);
    }
    else
    {
      auto variableAnalyser = RuntimeVariableAnalyser{};
      symbol.value().get().accept(variableAnalyser);
      handleVariableCall(node, variableAnalyser);
    }
  }
}